

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::GeneratedCodeInfo::_InternalParse
          (GeneratedCodeInfo *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  GeneratedCodeInfo_Annotation *msg;
  uint32 tag;
  char *local_38;
  uint local_2c;
  
  local_38 = ptr;
  while( true ) {
    bVar1 = internal::ParseContext::Done(ctx,&local_38);
    if (bVar1) {
      return local_38;
    }
    local_38 = internal::ReadTag(local_38,&local_2c,0);
    if (local_38 == (char *)0x0) break;
    if (local_2c == 10) {
      local_38 = local_38 + -1;
      do {
        local_38 = local_38 + 1;
        msg = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Add
                        (&this->annotation_);
        local_38 = internal::ParseContext::
                   ParseMessage<google::protobuf::GeneratedCodeInfo_Annotation>(ctx,msg,local_38);
        if (local_38 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == '\n'));
    }
    else {
      if ((local_2c == 0) || ((local_2c & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_2c - 1;
        return local_38;
      }
      local_38 = internal::UnknownFieldParse(local_2c,&this->_internal_metadata_,local_38,ctx);
      if (local_38 == (char *)0x0) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* GeneratedCodeInfo::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_annotation(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}